

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O2

string_t duckdb::HexIntegralOperator::Operation<long,duckdb::string_t>(long input,Vector *result)

{
  idx_t iVar1;
  char *pcVar2;
  ulong buffer_size;
  undefined1 auVar3 [16];
  string_t target;
  char *output;
  
  iVar1 = CountZeros<unsigned_long>::Leading(input);
  if (0x43 - iVar1 < 4) {
    auVar3 = duckdb::StringVector::EmptyString(result,1);
    target.value.pointer.ptr = (char *)auVar3._8_8_;
    pcVar2 = target.value.pointer.ptr;
    if (auVar3._0_4_ < 0xd) {
      pcVar2 = target.value.pointer.prefix;
    }
    *pcVar2 = '0';
    target.value._0_8_ = auVar3._0_8_;
  }
  else {
    buffer_size = 0x43 - iVar1 >> 2;
    target.value = (anon_union_16_2_67f50693_for_value)
                   duckdb::StringVector::EmptyString(result,buffer_size);
    output = target.value._8_8_;
    if (target.value._0_4_ < 0xd) {
      output = target.value.pointer.prefix;
    }
    WriteHexBytes(input,&output,buffer_size);
  }
  string_t::Finalize(&target);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)target;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {

		auto num_leading_zero = CountZeros<uint64_t>::Leading(static_cast<uint64_t>(input));
		idx_t num_bits_to_check = 64 - num_leading_zero;
		D_ASSERT(num_bits_to_check <= sizeof(INPUT_TYPE) * 8);

		idx_t buffer_size = (num_bits_to_check + 3) / 4;

		// Special case: All bits are zero
		if (buffer_size == 0) {
			auto target = StringVector::EmptyString(result, 1);
			auto output = target.GetDataWriteable();
			*output = '0';
			target.Finalize();
			return target;
		}

		D_ASSERT(buffer_size > 0);
		auto target = StringVector::EmptyString(result, buffer_size);
		auto output = target.GetDataWriteable();

		WriteHexBytes(static_cast<uint64_t>(input), output, buffer_size);

		target.Finalize();
		return target;
	}